

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<std::__cxx11::string,ft::allocator<std::__cxx11::string>>::
merge<bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
          (list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *x,_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
             *comp)

{
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar1
  ;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar2
  ;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar3
  ;
  bool bVar4;
  node *pnVar5;
  size_type sVar6;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar7
  ;
  
  if (((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this != x) && (x->m_size != 0)) {
    plVar7 = *(listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               **)(*(long *)this + 0x28);
    do {
      pnVar5 = x->m_head;
      if (plVar7 == *(listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)(this + 8)) {
LAB_00109742:
        plVar1 = pnVar5->next;
        if ((plVar7 == plVar1) || (plVar2 = plVar1->next, plVar7 == plVar2)) goto LAB_0010978c;
        plVar3 = plVar1->prev;
        plVar3->next = plVar2;
        plVar2->prev = plVar3;
        plVar2 = plVar7->prev;
        plVar2->next = plVar1;
        plVar1->prev = plVar2;
        plVar7->prev = plVar1;
        plVar1->next = plVar7;
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        sVar6 = x->m_size - 1;
        x->m_size = sVar6;
      }
      else {
        bVar4 = (*comp)(&pnVar5->next->data,&plVar7->data);
        if (bVar4) {
          pnVar5 = x->m_head;
          goto LAB_00109742;
        }
        plVar7 = plVar7->next;
LAB_0010978c:
        sVar6 = x->m_size;
      }
    } while (sVar6 != 0);
  }
  return;
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}